

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

uint32 heap64b_ins(float64 *a,uint32 *k,uint32 sz,float64 a_v,uint32 k_v,hcmpfn64b_t cmp)

{
  int iVar1;
  bool bVar2;
  uint local_40;
  uint local_3c;
  uint32 p;
  uint32 i;
  hcmpfn64b_t cmp_local;
  uint32 k_v_local;
  float64 a_v_local;
  uint32 sz_local;
  uint32 *k_local;
  float64 *a_local;
  
  local_40 = sz - 1;
  local_3c = sz;
  while( true ) {
    local_40 = local_40 >> 1;
    bVar2 = false;
    if (local_3c != 0) {
      iVar1 = (*cmp)(a[local_40],a_v);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    a[local_3c] = a[local_40];
    k[local_3c] = k[local_40];
    local_3c = local_40;
    local_40 = local_40 - 1;
  }
  a[local_3c] = a_v;
  k[local_3c] = k_v;
  return sz + 1;
}

Assistant:

uint32
heap64b_ins(float64 *a,  uint32 *k, uint32 sz,
	    float64 a_v, uint32 k_v,
	    hcmpfn64b_t cmp)
{
    uint32 i, p;

    ++sz;

    i = sz-1;
    p = PARENT(i);
    /* if the parent does not satisfy the ordering,
     * then switch with i */
    while ((i > 0) && !cmp(a[p], a_v)) {
	a[i] = a[p];
	k[i] = k[p];
	i = p;
	p = PARENT(p);
    }
    a[i] = a_v;
    k[i] = k_v;

    return sz;
}